

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::PushAddress
          (PeerManagerImpl *this,Peer *peer,CAddress *addr)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  CAddress *__n;
  CAddress *this_00;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  vector<CAddress,_std::allocator<CAddress>_> *in_stack_ffffffffffffff58;
  value_type *in_stack_ffffffffffffff60;
  Peer *in_stack_ffffffffffffff68;
  CNetAddr *in_stack_ffffffffffffff70;
  undefined5 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  pointer in_stack_ffffffffffffff80;
  bool local_69;
  Span<const_unsigned_char> in_stack_ffffffffffffffa0;
  CService local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_> *)
                     in_stack_ffffffffffffff58);
  if (!bVar1) {
    __assert_fail("peer.m_addr_known",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x4d9,
                  "void (anonymous namespace)::PeerManagerImpl::PushAddress(Peer &, const CAddress &)"
                 );
  }
  bVar2 = CNetAddr::IsValid(in_stack_ffffffffffffff70);
  bVar1 = false;
  local_69 = false;
  if (bVar2) {
    in_stack_ffffffffffffff80 =
         std::unique_ptr<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_>::operator->
                   ((unique_ptr<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_> *)
                    in_stack_ffffffffffffff58);
    CService::GetKey(&local_30);
    bVar1 = true;
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_ffffffffffffff68,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff7f =
         CRollingBloomFilter::contains(in_stack_ffffffffffffff80,in_stack_ffffffffffffffa0);
    local_69 = false;
    if (!(bool)in_stack_ffffffffffffff7f) {
      in_stack_ffffffffffffff7e =
           IsAddrCompatible(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      local_69 = (bool)in_stack_ffffffffffffff7e;
    }
  }
  if (bVar1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff68);
  }
  if ((local_69 & 1U) != 0) {
    sVar3 = std::vector<CAddress,_std::allocator<CAddress>_>::size(in_stack_ffffffffffffff58);
    if (sVar3 < 1000) {
      std::vector<CAddress,_std::allocator<CAddress>_>::push_back
                ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffff68,
                 in_stack_ffffffffffffff60);
    }
    else {
      this_00 = (CAddress *)(in_RSI + 0xf8);
      __n = (CAddress *)(in_RDI + 0x10);
      std::vector<CAddress,_std::allocator<CAddress>_>::size(in_stack_ffffffffffffff58);
      RandomMixin<FastRandomContext>::randrange<unsigned_long>
                ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffff80,
                 CONCAT17(in_stack_ffffffffffffff7f,
                          CONCAT16(in_stack_ffffffffffffff7e,
                                   CONCAT15(local_69,in_stack_ffffffffffffff78))));
      std::vector<CAddress,_std::allocator<CAddress>_>::operator[]
                ((vector<CAddress,_std::allocator<CAddress>_> *)this_00,(size_type)__n);
      CAddress::operator=(this_00,__n);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::PushAddress(Peer& peer, const CAddress& addr)
{
    // Known checking here is only to save space from duplicates.
    // Before sending, we'll filter it again for known addresses that were
    // added after addresses were pushed.
    assert(peer.m_addr_known);
    if (addr.IsValid() && !peer.m_addr_known->contains(addr.GetKey()) && IsAddrCompatible(peer, addr)) {
        if (peer.m_addrs_to_send.size() >= MAX_ADDR_TO_SEND) {
            peer.m_addrs_to_send[m_rng.randrange(peer.m_addrs_to_send.size())] = addr;
        } else {
            peer.m_addrs_to_send.push_back(addr);
        }
    }
}